

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosidemix.cpp
# Opt level: O2

Color __thiscall TwoSideMix::f(TwoSideMix *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  float fVar1;
  float extraout_XMM0_Da;
  float fVar2;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float in_XMM1_Da;
  float fVar3;
  Color CVar4;
  
  fVar1 = this->amount;
  (**this->componentA->_vptr_BSDF)();
  fVar2 = 1.0 - this->amount;
  fVar3 = in_XMM1_Da * fVar1;
  (**this->componentB->_vptr_BSDF)(this->componentB,wo,wi,hit);
  CVar4.z = fVar3 * fVar2 + in_XMM1_Da * fVar1;
  CVar4.x = extraout_XMM0_Da_00 * fVar2 + fVar1 * extraout_XMM0_Da;
  CVar4.y = extraout_XMM0_Db_00 * fVar2 + fVar1 * extraout_XMM0_Db;
  return CVar4;
}

Assistant:

Color TwoSideMix::f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
{
	return amount * componentA->f(wo,wi,hit)
	 + (1-amount) * componentB->f(wo,wi,hit);
}